

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

void init_frame(compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend,int stackpos,int stacktop
               )

{
  sljit_compiler *compiler;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  PCRE2_SPTR16 pPVar4;
  uint uVar5;
  int iVar7;
  PCRE2_SPTR16 cc_00;
  long lVar8;
  ulong uVar6;
  
  compiler = common->compiler;
  cc_00 = cc;
  if (ccend == (PCRE2_SPTR16)0x0) {
    pPVar4 = bracketend(cc);
    ccend = pPVar4 + -2;
    if ((*cc != 0x86) && (*cc != 0x8b)) {
      cc = next_opcode((compiler_common *)cc,cc_00);
    }
  }
  iVar7 = stackpos << 3;
  bVar3 = false;
  bVar1 = false;
  bVar2 = false;
LAB_00143c67:
  do {
    while( true ) {
      lVar8 = (long)iVar7;
      if (ccend <= cc) {
        sljit_emit_op1(compiler,0x20,0x8c,lVar8,0x40,0);
        return;
      }
      uVar5 = *(ushort *)&((compiler_common *)cc)->compiler - 0x75;
      uVar6 = (ulong)uVar5;
      if (uVar5 < 0x2a) break;
LAB_00143ca8:
      if (*(ushort *)&((compiler_common *)cc)->compiler == 3) {
        if (!bVar3) {
          sljit_emit_op1(compiler,0x20,1,0,0x8e,(long)common->ovector_start);
          sljit_emit_op1(compiler,0x20,0x8c,lVar8,0x40,-(long)common->ovector_start);
          cc_00 = (PCRE2_SPTR16)&DAT_00000020;
          sljit_emit_op1(compiler,0x20,0x8c,(long)(iVar7 + -8),1,0);
          iVar7 = iVar7 + -0x10;
        }
        cc = (PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + 2);
        bVar3 = true;
      }
      else {
        cc = next_opcode((compiler_common *)cc,cc_00);
      }
    }
    if ((0x630000UL >> (uVar6 & 0x3f) & 1) != 0) {
      if (!bVar2 && (long)common->capture_last_ptr != 0) {
        bVar2 = true;
        sljit_emit_op1(compiler,0x20,1,0,0x8e,(long)common->capture_last_ptr);
        sljit_emit_op1(compiler,0x20,0x8c,lVar8,0x40,-(long)common->capture_last_ptr);
        sljit_emit_op1(compiler,0x20,0x8c,(long)(iVar7 + -8),1,0);
        iVar7 = iVar7 + -0x10;
      }
      lVar8 = (ulong)*(ushort *)((long)&((compiler_common *)cc)->compiler + 4) * 0x10;
      sljit_emit_op1(compiler,0x20,0x8c,(long)iVar7,0x40,common->ovector_start + lVar8);
      sljit_emit_op1(compiler,0x20,1,0,0x8e,common->ovector_start + lVar8);
      sljit_emit_op1(compiler,0x20,4,0,0x8e,common->ovector_start + lVar8 + 8);
      sljit_emit_op1(compiler,0x20,0x8c,(long)(iVar7 + -8),1,0);
      cc_00 = (PCRE2_SPTR16)&DAT_00000020;
      sljit_emit_op1(compiler,0x20,0x8c,(long)(iVar7 + -0x10),4,0);
      iVar7 = iVar7 + -0x18;
      cc = (PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + 6);
      goto LAB_00143c67;
    }
    if ((0x28a00000000U >> (uVar6 & 0x3f) & 1) == 0) {
      if (uVar6 != 0) goto LAB_00143ca8;
      if (!bVar3 && common->has_set_som != 0) {
        sljit_emit_op1(compiler,0x20,1,0,0x8e,(long)common->ovector_start);
        sljit_emit_op1(compiler,0x20,0x8c,lVar8,0x40,-(long)common->ovector_start);
        cc_00 = (PCRE2_SPTR16)&DAT_00000020;
        sljit_emit_op1(compiler,0x20,0x8c,(long)(iVar7 + -8),1,0);
        iVar7 = iVar7 + -0x10;
        bVar3 = true;
      }
      if (!bVar1 && (long)common->mark_ptr != 0) {
        sljit_emit_op1(compiler,0x20,1,0,0x8e,(long)common->mark_ptr);
        sljit_emit_op1(compiler,0x20,0x8c,(long)iVar7,0x40,-(long)common->mark_ptr);
        cc_00 = (PCRE2_SPTR16)&DAT_00000020;
        sljit_emit_op1(compiler,0x20,0x8c,(long)(iVar7 + -8),1,0);
        iVar7 = iVar7 + -0x10;
        bVar1 = true;
      }
      if (!bVar2 && (long)common->capture_last_ptr != 0) {
        sljit_emit_op1(compiler,0x20,1,0,0x8e,(long)common->capture_last_ptr);
        sljit_emit_op1(compiler,0x20,0x8c,(long)iVar7,0x40,-(long)common->capture_last_ptr);
        cc_00 = (PCRE2_SPTR16)&DAT_00000020;
        sljit_emit_op1(compiler,0x20,0x8c,(long)(iVar7 + -8),1,0);
        iVar7 = iVar7 + -0x10;
        bVar2 = true;
      }
      cc = (PCRE2_SPTR16)((long)&((compiler_common *)cc)->compiler + 4);
    }
    else {
      if (!bVar1) {
        sljit_emit_op1(compiler,0x20,1,0,0x8e,(long)common->mark_ptr);
        sljit_emit_op1(compiler,0x20,0x8c,lVar8,0x40,-(long)common->mark_ptr);
        cc_00 = (PCRE2_SPTR16)&DAT_00000020;
        sljit_emit_op1(compiler,0x20,0x8c,(long)(iVar7 + -8),1,0);
        iVar7 = iVar7 + -0x10;
      }
      cc = (PCRE2_SPTR16)
           ((long)&((compiler_common *)cc)->compiler +
           (ulong)*(ushort *)((long)&((compiler_common *)cc)->compiler + 2) * 2 + 6);
      bVar1 = true;
    }
  } while( true );
}

Assistant:

static void init_frame(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend, int stackpos, int stacktop)
{
DEFINE_COMPILER;
BOOL setsom_found = FALSE;
BOOL setmark_found = FALSE;
/* The last capture is a local variable even for recursions. */
BOOL capture_last_found = FALSE;
int offset;

/* >= 1 + shortest item size (2) */
SLJIT_UNUSED_ARG(stacktop);
SLJIT_ASSERT(stackpos >= stacktop + 2);

stackpos = STACK(stackpos);
if (ccend == NULL)
  {
  ccend = bracketend(cc) - (1 + LINK_SIZE);
  if (*cc != OP_CBRAPOS && *cc != OP_SCBRAPOS)
    cc = next_opcode(common, cc);
  }

SLJIT_ASSERT(cc != NULL);
while (cc < ccend)
  switch(*cc)
    {
    case OP_SET_SOM:
    SLJIT_ASSERT(common->has_set_som);
    if (!setsom_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(0));
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -OVECTOR(0));
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      setsom_found = TRUE;
      }
    cc += 1;
    break;

    case OP_MARK:
    case OP_COMMIT_ARG:
    case OP_PRUNE_ARG:
    case OP_THEN_ARG:
    SLJIT_ASSERT(common->mark_ptr != 0);
    if (!setmark_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->mark_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -common->mark_ptr);
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      setmark_found = TRUE;
      }
    cc += 1 + 2 + cc[1];
    break;

    case OP_RECURSE:
    if (common->has_set_som && !setsom_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(0));
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -OVECTOR(0));
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      setsom_found = TRUE;
      }
    if (common->mark_ptr != 0 && !setmark_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->mark_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -common->mark_ptr);
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      setmark_found = TRUE;
      }
    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->capture_last_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -common->capture_last_ptr);
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      capture_last_found = TRUE;
      }
    cc += 1 + LINK_SIZE;
    break;

    case OP_CBRA:
    case OP_CBRAPOS:
    case OP_SCBRA:
    case OP_SCBRAPOS:
    if (common->capture_last_ptr != 0 && !capture_last_found)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->capture_last_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, -common->capture_last_ptr);
      stackpos -= (int)sizeof(sljit_sw);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
      stackpos -= (int)sizeof(sljit_sw);
      capture_last_found = TRUE;
      }
    offset = (GET2(cc, 1 + LINK_SIZE)) << 1;
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, OVECTOR(offset));
    stackpos -= (int)sizeof(sljit_sw);
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP1, 0);
    stackpos -= (int)sizeof(sljit_sw);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, TMP2, 0);
    stackpos -= (int)sizeof(sljit_sw);

    cc += 1 + LINK_SIZE + IMM2_SIZE;
    break;

    default:
    cc = next_opcode(common, cc);
    SLJIT_ASSERT(cc != NULL);
    break;
    }

OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), stackpos, SLJIT_IMM, 0);
SLJIT_ASSERT(stackpos == STACK(stacktop));
}